

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O1

void __thiscall
slang::ast::AssignmentExpression::visitExprs<cast_signed_index::MainVisitor&>
          (AssignmentExpression *this,AlwaysFFVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<cast_signed_index::MainVisitor>(this->timingControl,visitor);
  }
  Expression::visitExpression<slang::ast::Expression_const,cast_signed_index::MainVisitor&>
            (this->left_,this->left_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,cast_signed_index::MainVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }